

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O3

void sb_bmp_mask_init(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  
  bmp_basic_mask[0] = 0x80;
  bmp_basic_mask[1] = '@';
  bmp_basic_mask[2] = ' ';
  bmp_basic_mask[3] = '\x10';
  bmp_basic_mask[4] = '\b';
  bmp_basic_mask[5] = '\x04';
  bmp_basic_mask[6] = '\x02';
  bmp_basic_mask[7] = '\x01';
  lVar1 = 0;
  do {
    lVar2 = 0;
    do {
      bmp_2d_mask[lVar1][lVar2] = '\0';
      if ((ulong)(lVar2 + lVar1) < 9 && lVar2 != 0) {
        lVar3 = 0;
        bVar4 = 0;
        do {
          bVar4 = bVar4 | bmp_basic_mask[lVar1 + lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar2 != lVar3);
        bmp_2d_mask[lVar1][lVar2] = bVar4;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 9);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  return;
}

Assistant:

void sb_bmp_mask_init()
{
    // preset masks to speed up bitmap set/clear operations
    size_t i, pos, len;
    for (i=0; i<8; ++i) {
        bmp_basic_mask[i] = 0x1 << (7-i);
    }
    for (pos=0; pos<8; ++pos) {
        for (len=0; len<9; ++len) {
            bmp_2d_mask[pos][len] = 0x0;
            if (len != 0 && pos+len <= 8) {
                for (i=0; i<len; ++i) {
                    bmp_2d_mask[pos][len] |= bmp_basic_mask[pos+i];
                }
            }
        }
    }
}